

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialTransform * RigidBodyDynamics::Math::Xrot(Scalar angle_rad,Vector3d *axis)

{
  CoeffReturnType pdVar1;
  SpatialTransform *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double *v1;
  double *v0;
  double dVar3;
  double dVar4;
  double *m02;
  double *m01;
  Matrix3_t *this;
  double *m20;
  double *m21;
  Scalar c;
  Scalar s;
  Index in_stack_fffffffffffffe38;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffe40;
  Vector3d *translation;
  Matrix3d *rotation;
  SpatialTransform *this_00;
  double *v2;
  Vector3_t *this_01;
  double *m11;
  double *m10;
  double *m00;
  double *m12;
  double *m22;
  undefined1 local_c0 [24];
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_30;
  double local_28;
  double local_18;
  
  local_18 = in_XMM0_Qa;
  local_28 = sin(in_XMM0_Qa);
  local_30 = cos(local_18);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_80 = dVar3 * *pdVar1 * (1.0 - local_30) + local_30;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  dVar3 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  dVar4 = *pdVar1;
  dVar2 = 1.0 - local_30;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_88 = dVar3 * dVar4 * dVar2 + *pdVar1 * local_28;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  v2 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  v1 = (double *)((double)v2 * *pdVar1);
  v0 = (double *)(1.0 - local_30);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_90 = (double)v1 * (double)v0 + -(*pdVar1 * local_28);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  this_01 = (Vector3_t *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  dVar3 = (double)this_01 * *pdVar1;
  dVar4 = 1.0 - local_30;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_98 = dVar3 * dVar4 + -(*pdVar1 * local_28);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m11 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_a0 = (double)m11 * *pdVar1 * (1.0 - local_30) + local_30;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m10 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m02 = (double *)((double)m10 * *pdVar1);
  m01 = (double *)(1.0 - local_30);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_a8 = (double)m02 * (double)m01 + *pdVar1 * local_28;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m00 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  this = (Matrix3_t *)((double)m00 * *pdVar1);
  dVar3 = 1.0 - local_30;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_c0._16_8_ = (double)this * dVar3 + *pdVar1 * local_28;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m12 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m20 = (double *)((double)m12 * *pdVar1);
  m21 = (double *)(1.0 - local_30);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_c0._8_8_ = (double)m20 * (double)m21 + -(*pdVar1 * local_28);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  m22 = (double *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_c0._0_8_ = (double)m22 * *pdVar1 * (1.0 - local_30) + local_30;
  translation = (Vector3d *)(local_c0 + 0x10);
  rotation = (Matrix3d *)(local_c0 + 8);
  this_00 = (SpatialTransform *)local_c0;
  Matrix3_t::Matrix3_t(this,m00,m01,m02,m10,m11,m12,m20,m21,m22);
  Vector3_t::Vector3_t(this_01,v0,v1,v2);
  SpatialTransform::SpatialTransform(this_00,rotation,translation);
  return in_RDI;
}

Assistant:

inline SpatialTransform Xrot (Scalar angle_rad, const Vector3d &axis) {
  Scalar s, c;
  s = sin(angle_rad);
  c = cos(angle_rad);

  return SpatialTransform (
      Matrix3d (
        axis[0] * axis[0] * (1.0f - c) + c,
        axis[1] * axis[0] * (1.0f - c) + axis[2] * s,
        axis[0] * axis[2] * (1.0f - c) - axis[1] * s,

        axis[0] * axis[1] * (1.0f - c) - axis[2] * s,
        axis[1] * axis[1] * (1.0f - c) + c,
        axis[1] * axis[2] * (1.0f - c) + axis[0] * s,

        axis[0] * axis[2] * (1.0f - c) + axis[1] * s,
        axis[1] * axis[2] * (1.0f - c) - axis[0] * s,
        axis[2] * axis[2] * (1.0f - c) + c

        ),
      Vector3d (0., 0., 0.)
      );
}